

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.h
# Opt level: O0

void __thiscall rengine::AnimationManager::~AnimationManager(AnimationManager *this)

{
  AnimationManager *this_local;
  
  ~AnimationManager(this);
  operator_delete(this);
  return;
}

Assistant:

AnimationManager()
    {
    }